

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsIis.cpp
# Opt level: O1

bool __thiscall HighsIis::trivial(HighsIis *this,HighsLp *lp,HighsOptions *options)

{
  double *pdVar1;
  pointer piVar2;
  pointer piVar3;
  int iVar4;
  int iVar5;
  HighsInt status;
  long lVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  bool bVar11;
  double dVar12;
  vector<int,_std::allocator<int>_> count;
  value_type_conflict2 local_4c;
  vector<int,_std::allocator<int>_> local_48;
  int iVar6;
  
  invalidate(this);
  iVar4 = (options->super_HighsOptionsStruct).iis_strategy;
  uVar10 = 0;
  do {
    if (uVar10 == (iVar4 != 1)) {
      if (0 < (long)lp->num_col_) {
        dVar12 = (options->super_HighsOptionsStruct).primal_feasibility_tolerance;
        lVar7 = 0;
        do {
          if (dVar12 + dVar12 <
              (lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar7] -
              (lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar7]) {
            addCol(this,(HighsInt)lVar7,4);
            break;
          }
          lVar7 = lVar7 + 1;
        } while (lp->num_col_ != lVar7);
      }
      if ((this->col_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (this->col_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start) break;
    }
    else {
      if (0 < (long)lp->num_row_) {
        dVar12 = (options->super_HighsOptionsStruct).primal_feasibility_tolerance;
        lVar7 = 0;
        do {
          if (dVar12 + dVar12 <
              (lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar7] -
              (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar7]) {
            addRow(this,(HighsInt)lVar7,4);
            break;
          }
          lVar7 = lVar7 + 1;
        } while (lp->num_row_ != lVar7);
      }
      if ((this->row_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (this->row_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start) break;
    }
    bVar11 = uVar10 == 0;
    uVar10 = uVar10 + 1;
  } while (bVar11);
  iVar4 = (int)((ulong)((long)(this->col_index_).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->col_index_).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 2);
  iVar6 = (int)((ulong)((long)(this->row_index_).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->row_index_).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 2);
  iVar5 = iVar6 + iVar4;
  if (iVar5 == 0 || SCARRY4(iVar6,iVar4) != iVar5 < 0) {
    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_4c = 0;
    std::vector<int,_std::allocator<int>_>::_M_fill_assign(&local_48,(long)lp->num_row_,&local_4c);
    if (0 < lp->num_col_) {
      piVar2 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar3 = (lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar7 = 0;
      do {
        lVar9 = (long)piVar2[lVar7];
        lVar8 = lVar7 + 1;
        if (piVar2[lVar7] < piVar2[lVar7 + 1]) {
          do {
            local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[piVar3[lVar9]] =
                 local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[piVar3[lVar9]] + 1;
            lVar9 = lVar9 + 1;
          } while (lVar9 < piVar2[lVar8]);
        }
        lVar7 = lVar8;
      } while (lVar8 < lp->num_col_);
    }
    bVar11 = 0 < lp->num_row_;
    if (0 < lp->num_row_) {
      lVar7 = 0;
      do {
        if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar7] < 1) {
          dVar12 = (options->super_HighsOptionsStruct).primal_feasibility_tolerance;
          status = 2;
          if ((dVar12 < (lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                        .super__Vector_impl_data._M_start[lVar7]) ||
             (dVar12 = -dVar12, status = 3,
             pdVar1 = (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar7,
             *pdVar1 <= dVar12 && dVar12 != *pdVar1)) {
            addRow(this,(HighsInt)lVar7,status);
          }
          if ((this->row_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              (this->row_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start) {
            this->valid_ = true;
            this->strategy_ = (options->super_HighsOptionsStruct).iis_strategy;
            break;
          }
        }
        lVar7 = lVar7 + 1;
        bVar11 = lVar7 < lp->num_row_;
      } while (lVar7 < lp->num_row_);
    }
    if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  else {
    this->valid_ = true;
    this->strategy_ = (options->super_HighsOptionsStruct).iis_strategy;
    bVar11 = true;
  }
  return bVar11;
}

Assistant:

bool HighsIis::trivial(const HighsLp& lp, const HighsOptions& options) {
  this->invalidate();
  const bool col_priority =
      //      options.iis_strategy == kIisStrategyFromRayColPriority ||
      options.iis_strategy == kIisStrategyFromLpColPriority;
  for (HighsInt k = 0; k < 2; k++) {
    if ((col_priority && k == 0) || (!col_priority && k == 1)) {
      // Loop over columns first
      for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
        if (lp.col_lower_[iCol] - lp.col_upper_[iCol] >
            2 * options.primal_feasibility_tolerance) {
          this->addCol(iCol, kIisBoundStatusBoxed);
          break;
        }
      }
      if (this->col_index_.size() > 0) break;
    } else {
      // Loop over rows first
      for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
        if (lp.row_lower_[iRow] - lp.row_upper_[iRow] >
            2 * options.primal_feasibility_tolerance) {
          this->addRow(iRow, kIisBoundStatusBoxed);
          break;
        }
      }
      if (this->row_index_.size() > 0) break;
    }
  }
  HighsInt num_iis_col = this->col_index_.size();
  HighsInt num_iis_row = this->row_index_.size();
  // If one is found then we're done
  if (num_iis_col + num_iis_row > 0) {
    // Should have found exactly 1
    assert((num_iis_col == 1 || num_iis_row == 1) &&
           num_iis_col + num_iis_row < 2);
    this->valid_ = true;
    this->strategy_ = options.iis_strategy;
    return true;
  }
  // Now look for empty rows that cannot have zero activity
  std::vector<HighsInt> count;
  count.assign(lp.num_row_, 0);
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    for (HighsInt iEl = lp.a_matrix_.start_[iCol];
         iEl < lp.a_matrix_.start_[iCol + 1]; iEl++)
      count[lp.a_matrix_.index_[iEl]]++;
  }
  assert(this->row_index_.size() == 0);
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    if (count[iRow] > 0) continue;
    if (lp.row_lower_[iRow] > options.primal_feasibility_tolerance) {
      this->addRow(iRow, kIisBoundStatusLower);
    } else if (lp.row_upper_[iRow] < -options.primal_feasibility_tolerance) {
      this->addRow(iRow, kIisBoundStatusUpper);
    }
    if (this->row_index_.size() > 0) {
      this->valid_ = true;
      this->strategy_ = options.iis_strategy;
      return true;
    }
  }
  return false;
}